

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O2

boolean encode_mcu_DC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_encoder *pjVar1;
  uint uVar2;
  long lVar3;
  
  pjVar1 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar2 = *(uint *)&pjVar1[4].start_pass;
    if (uVar2 == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar1[4].start_pass + 4));
      uVar2 = cinfo->restart_interval;
      *(uint *)((long)&pjVar1[4].start_pass + 4) =
           *(int *)((long)&pjVar1[4].start_pass + 4) + 1U & 7;
    }
    *(uint *)&pjVar1[4].start_pass = uVar2 - 1;
  }
  uVar2 = cinfo->Al;
  for (lVar3 = 0; lVar3 < cinfo->blocks_in_MCU; lVar3 = lVar3 + 1) {
    arith_encode(cinfo,(uchar *)(pjVar1 + 0xf),
                 (uint)(((uint)(int)(*MCU_data[lVar3])[0] >> (uVar2 & 0x1f) & 1) != 0));
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_refine(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  register int temp;
  int blkn;
  int Al = cinfo->Al;
  JBLOCKROW block;

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart(entropy, entropy->next_restart_num);

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];

    /* We simply emit the Al'th bit of the DC coefficient value. */
    temp = (*block)[0];
    emit_bits(entropy, (unsigned int)(temp >> Al), 1);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}